

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsViewPrivate::mapRectFromScene
          (QRectF *__return_storage_ptr__,QGraphicsViewPrivate *this,QRectF *rect)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double local_48;
  double dStack_40;
  qreal local_38;
  qreal qStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(uint *)&this->field_0x300;
  if ((uVar2 & 0x20) != 0) {
    updateScroll(this);
    uVar2 = *(uint *)&this->field_0x300;
  }
  if ((uVar2 & 0x10) == 0) {
    QTransform::mapRect((QRectF *)&local_48);
  }
  else {
    local_48 = rect->xp;
    dStack_40 = rect->yp;
    local_38 = rect->w;
    qStack_30 = rect->h;
  }
  lVar1 = this->scrollY;
  __return_storage_ptr__->xp = (double)-this->scrollX + local_48;
  __return_storage_ptr__->yp = (double)-lVar1 + dStack_40;
  __return_storage_ptr__->w = local_38;
  __return_storage_ptr__->h = qStack_30;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectFromScene(const QRectF &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    return (identityMatrix ? rect : matrix.mapRect(rect)).translated(-scrollX, -scrollY);
}